

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int lj_cf_jit_profile_start(lua_State *L)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  GCfunc *L_00;
  lua_State *L_01;
  TValue *pTVar4;
  luaJIT_profile_callback in_RDI;
  TValue key;
  lua_State *L2;
  GCfunc *func;
  GCstr *mode;
  GCtab *registry;
  GCobj *o;
  undefined8 in_stack_fffffffffffffec8;
  lua_State *in_stack_fffffffffffffed0;
  lua_State *in_stack_fffffffffffffed8;
  luaJIT_profile_callback data;
  lua_State *in_stack_fffffffffffffee0;
  luaJIT_profile_callback cb;
  char *mode_00;
  
  uVar1 = *(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x118);
  uVar3 = (ulong)uVar1;
  lj_lib_optstr(in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
  L_00 = lj_lib_checkfunc(in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20))
  ;
  L_01 = lua_newthread(in_stack_fffffffffffffed8);
  data = in_RDI;
  pTVar4 = lj_tab_set((lua_State *)&L_00->c,(GCtab *)L_01,(cTValue *)0x8000000000000074);
  (pTVar4->u32).lo = (uint32_t)L_01;
  (pTVar4->field_2).it = 0xfffffff9;
  mode_00 = (char *)0x8000000000000066;
  cb = in_RDI;
  pTVar4 = lj_tab_set((lua_State *)&L_00->c,(GCtab *)L_01,(cTValue *)0x8000000000000066);
  (pTVar4->u32).lo = (uint32_t)L_00;
  (pTVar4->field_2).it = 0xfffffff7;
  if ((*(byte *)(uVar3 + 4) & 4) != 0) {
    uVar2 = *(uint *)(in_RDI + 8);
    *(byte *)(uVar3 + 4) = *(byte *)(uVar3 + 4) & 0xfb;
    *(undefined4 *)(uVar3 + 0xc) = *(undefined4 *)((ulong)uVar2 + 0x6c);
    *(uint *)((ulong)uVar2 + 0x6c) = uVar1;
  }
  luaJIT_profile_start(L_01,mode_00,cb,data);
  return 0;
}

Assistant:

LJLIB_CF(jit_profile_start)
{
  GCtab *registry = tabV(registry(L));
  GCstr *mode = lj_lib_optstr(L, 1);
  GCfunc *func = lj_lib_checkfunc(L, 2);
  lua_State *L2 = lua_newthread(L);  /* Thread that runs profiler callback. */
  TValue key;
  /* Anchor thread and function in registry. */
  key.u64 = KEY_PROFILE_THREAD;
  setthreadV(L, lj_tab_set(L, registry, &key), L2);
  key.u64 = KEY_PROFILE_FUNC;
  setfuncV(L, lj_tab_set(L, registry, &key), func);
  lj_gc_anybarriert(L, registry);
  luaJIT_profile_start(L, mode ? strdata(mode) : "",
		       (luaJIT_profile_callback)jit_profile_callback, L2);
  return 0;
}